

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

void __thiscall SharedMemRingBuffer::SharedMemRingBuffer(SharedMemRingBuffer *this)

{
  long in_RDI;
  RingBuffer<_PositionInfo__*> *in_stack_ffffffffffffffe0;
  
  RingBuffer<_PositionInfo__*>::RingBuffer(in_stack_ffffffffffffffe0);
  SharedMemoryManager::SharedMemoryManager((SharedMemoryManager *)0x10e9f4);
  SharedMemoryManager::SharedMemoryManager((SharedMemoryManager *)0x10ea07);
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 2;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

SharedMemRingBuffer::SharedMemRingBuffer()
{
    max_data_size_ = 0;
    buffer_size_ = 0;
    total_mem_size_ = 0;
    ring_buffer_status_on_shared_mem_ = NULL;
    wait_strategy_type_ = SLEEPING_WAIT ;
    wait_strategy_ = NULL;
}